

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_long,_4UL>_&>::DescribeTo
          (ElementsAreMatcherImpl<const_std::array<unsigned_long,_4UL>_&> *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  string local_58;
  MatcherInterface<const_std::array<unsigned_long,_4UL>_&> local_38;
  
  lVar1 = ((long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (lVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"has 1 element that ",0x13);
    MatcherBase<const_unsigned_long_&>::DescribeTo
              (&((this->matchers_).
                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super_MatcherBase<const_unsigned_long_&>,os);
    return;
  }
  if (lVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"is empty",8);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"has ",4);
  Elements((ElementsAreMatcherImpl<const_std::array<unsigned_long,_4UL>_&> *)&local_38,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  Message::GetString_abi_cxx11_(&local_58,(Message *)&local_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," where\n",7);
  if (local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface != (_func_int **)0x0)
  {
    (**(code **)(*(_func_int **)
                  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))();
  }
  if ((this->matchers_).
      super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->matchers_).
      super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar1 = 0;
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"element #",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      MatcherBase<const_unsigned_long_&>::DescribeTo
                ((MatcherBase<const_unsigned_long_&> *)
                 ((long)&(((this->matchers_).
                           super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_MatcherBase<const_unsigned_long_&>).super_MatcherDescriberInterface.
                         _vptr_MatcherDescriberInterface + lVar1),os);
      uVar3 = uVar3 + 1;
      if (uVar3 < (ulong)(((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,",\n",2);
      }
      lVar1 = lVar1 + 0x18;
    } while (uVar3 != ((long)(this->matchers_).
                             super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->matchers_).
                             super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "is empty";
    } else if (count() == 1) {
      *os << "has 1 element that ";
      matchers_[0].DescribeTo(os);
    } else {
      *os << "has " << Elements(count()) << " where\n";
      for (size_t i = 0; i != count(); ++i) {
        *os << "element #" << i << " ";
        matchers_[i].DescribeTo(os);
        if (i + 1 < count()) {
          *os << ",\n";
        }
      }
    }
  }